

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

char * __thiscall
viennamath::variable_index_out_of_bounds_exception::what
          (variable_index_out_of_bounds_exception *this)

{
  ostream *poVar1;
  stringstream ss;
  char *local_1b0 [4];
  stringstream local_190 [16];
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  poVar1 = std::operator<<(local_180,
                           "Encountered an variable<> type with id larger or equal to the size of the supplied vector of values. id="
                          );
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,", vector_size=");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::stringstream::~stringstream(local_190);
  return local_1b0[0];
}

Assistant:

const char * what() const throw()
    {
      std::stringstream ss;
      ss << "Encountered an variable<> type with id larger or equal to the size of the supplied vector of values. id=" << id_ << ", vector_size=" << vector_size_ << std::endl;
      return ss.str().c_str();
    }